

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<Qt::GestureType>::
appendIteratorRange<QHash<Qt::GestureType,int>::key_iterator>
          (QCommonArrayOps<Qt::GestureType> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<Qt::GestureType,_int>::key_iterator> param_3)

{
  Span *pSVar1;
  long lVar2;
  ulong uVar3;
  Data<QHashPrivate::Node<Qt::GestureType,_int>_> *pDVar4;
  GestureType *pGVar5;
  
  uVar3 = b.i.i.bucket;
  pDVar4 = b.i.i.d;
  if (uVar3 != e.i.i.bucket || pDVar4 != e.i.i.d) {
    lVar2 = (this->super_Type).super_QArrayDataPointer<Qt::GestureType>.size;
    pGVar5 = (this->super_Type).super_QArrayDataPointer<Qt::GestureType>.ptr + lVar2;
    do {
      pSVar1 = pDVar4->spans;
      *pGVar5 = *(GestureType *)
                 pSVar1[uVar3 >> 7].entries[pSVar1[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.
                 data;
      lVar2 = lVar2 + 1;
      (this->super_Type).super_QArrayDataPointer<Qt::GestureType>.size = lVar2;
      pGVar5 = pGVar5 + 1;
      do {
        if (pDVar4->numBuckets - 1 == uVar3) {
          pDVar4 = (Data<QHashPrivate::Node<Qt::GestureType,_int>_> *)0x0;
          uVar3 = 0;
          break;
        }
        uVar3 = uVar3 + 1;
      } while (pSVar1[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    } while (uVar3 != e.i.i.bucket || pDVar4 != e.i.i.d);
  }
  return;
}

Assistant:

bool operator==(iterator other) const noexcept
    { return d == other.d && bucket == other.bucket; }